

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gen_keys.c
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  ulp_private_key *local_20;
  ulp_public_key *local_18;
  
  local_18 = (ulp_public_key *)0x0;
  local_20 = (ulp_private_key *)0x0;
  iVar1 = ulp_generate_key_pair(0x100,0x80,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&local_18,&local_20);
  if (((((local_18 != (ulp_public_key *)0x0 && iVar1 == 0) && (local_18->n == 0x100)) &&
       (local_18->l == 0x80)) && ((local_18->q == 0x3f8c027d93dd95 && (local_18->se == 0x1fe2f37))))
     && (local_18->A != (uint64_t *)0x0)) {
    if (((local_20 != (ulp_private_key *)0x0 && local_18->P != (uint64_t *)0x0) &&
        (local_20->n == 0x100)) &&
       ((local_20->l == 0x80 &&
        ((local_20->q == 0x3f8c027d93dd95 && (local_20->S != (uint64_t *)0x0)))))) {
      lVar2 = 0;
      do {
        if (0x3f8c027d93dd94 < local_18->A[lVar2]) goto LAB_001012d0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10000);
      lVar2 = 0;
      do {
        if ((0x3f8c027d93dd94 < local_18->P[lVar2]) || (0x1da7d < local_20->S[lVar2]))
        goto LAB_001012d0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x8000);
      ulp_free_public_key(local_18);
      iVar1 = 0;
      goto LAB_001012da;
    }
  }
LAB_001012d0:
  ulp_free_public_key(local_18);
  iVar1 = 1;
LAB_001012da:
  ulp_free_private_key(local_20);
  return iVar1;
}

Assistant:

int main() {

    ulp_public_key* pub_key = NULL;
    ulp_private_key* priv_key = NULL;

    size_t n = 256;
    size_t l = 128;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->l != l || pub_key->q != q || pub_key->se != se || pub_key->A == NULL || pub_key->P == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->l != l || priv_key->q != q || priv_key->S == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n*n; i++) {
        if(pub_key->A[i] >= q)
            goto error;
    }

    for(size_t i = 0; i < l*n; i++) {
        if(pub_key->P[i] >= q)
            goto error;
        if(priv_key->S[i] >= sk)
            goto error;
    }

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        return 1;

}